

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

void __thiscall w3Module::read_section(w3Module *this,uint8_t **cursor)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  ulong uVar4;
  code *pcVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *end;
  ulong uVar8;
  string local_68;
  uint8_t *local_48;
  ulong local_40;
  uint8_t *local_38;
  
  puVar1 = *cursor;
  bVar2 = ::read_varuint7(cursor,this->end);
  uVar6 = (uint)bVar2;
  if (0xb < bVar2) {
    StringFormat_abi_cxx11_
              (&local_68,"malformed line:%d id:%X payload:%p base:%p end:%p",0x296,(ulong)uVar6,
               puVar1,this->base,this->end);
    ThrowString(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x298,
         (long)*cursor - (long)this->base);
  uVar3 = ::read_varuint32(cursor,this->end);
  uVar8 = (ulong)uVar3;
  printf("%s payload_size:%lX\n","read_section",uVar8);
  puVar1 = *cursor;
  end = this->end;
  uVar7 = (uint)bVar2;
  local_38 = puVar1;
  if (uVar6 == 0) {
    uVar3 = ::read_varuint32(cursor,end);
    local_40 = (ulong)uVar3;
    local_48 = *cursor;
    end = this->end;
    if (end < local_48 + uVar3) {
      StringFormat_abi_cxx11_(&local_68,"malformed %d",0x2a4);
      ThrowString(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      end = this->end;
    }
  }
  else {
    local_40 = 0;
    local_48 = (uint8_t *)0x0;
  }
  if (end < puVar1 + uVar8) {
    StringFormat_abi_cxx11_
              (&local_68,"malformed line:%d id:%X payload:%p payload_size:%lX base:%p end:%p",0x2a7,
               (ulong)uVar7,puVar1,uVar8,this->base,end);
    ThrowString(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2a9,
         (long)*cursor - (long)this->base);
  *cursor = puVar1 + uVar8;
  if (bVar2 == 0) {
    if ((uint)local_40 < 0x7fffffff) {
      printf("skipping custom section:.%.*s\n",local_40,local_48);
    }
  }
  else {
    printf("%s(%d)\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2b5
          );
    uVar4 = (ulong)(uVar7 * 0x50);
    *(uint *)((long)&this->sections[0].id + uVar4) = uVar7;
    *(uint8_t **)((long)&this->sections[0].name.data + uVar4) = local_48;
    *(ulong *)((long)&this->sections[0].name.size + uVar4) = local_40 & 0xffffffff;
    *(ulong *)((long)&this->sections[0].payload_size + uVar4) = uVar8;
    *(uint8_t **)((long)&this->sections[0].payload + uVar4) = puVar1;
    printf("%s(%d) %d\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2be
           ,(ulong)uVar6);
    pcVar5 = (code *)section_traits[uVar7].read;
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + (long)this->_vptr_w3Module + -1);
    }
    (*pcVar5)(this,&local_38);
    if (local_38 != *cursor) {
      StringFormat_abi_cxx11_
                (&local_68,"failed to read section:%X payload:%p cursor:%p\n",(ulong)uVar6);
      ThrowString(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void w3Module::read_section (uint8_t** cursor)
{
    uint8_t* payload = *cursor;
    const uint32_t id = read_varuint7 (cursor);

    if (id > 11)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p base:%p end:%p", __LINE__, id, payload, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    const size_t payload_size = read_varuint32 (cursor);
    printf ("%s payload_size:%" FORMAT_SIZE "X\n", __func__, (long_t)payload_size);
    payload = *cursor;
    uint32_t name_size = 0;
    PCH local_name = 0;
    if (id == 0)
    {
        name_size = read_varuint32 (cursor);
        local_name = (PCH)*cursor;
        if (local_name + name_size > (PCH)end)
            ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    }
    if (payload + payload_size > end)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p payload_size:%" FORMAT_SIZE "X base:%p end:%p", __LINE__, id, payload, (long_t)payload_size, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    *cursor = payload + payload_size;

    if (id == 0)
    {
        if (name_size < INT_MAX)
            printf ("skipping custom section:.%.*s\n", (int)name_size, local_name);
        // UNDONE custom sections
        return;
    }

    printf("%s(%d)\n", __FILE__, __LINE__);

    w3Section& section = sections [id];
    section.id = id;
    section.name.data = local_name;
    section.name.size = name_size;
    section.payload_size = payload_size;
    section.payload = payload;

    printf("%s(%d) %d\n", __FILE__, __LINE__, (int)id);
    //DebugBreak ();

    (this->*section_traits [id].read) (&payload);

    if (payload != *cursor)
        ThrowString (StringFormat ("failed to read section:%X payload:%p cursor:%p\n", id, payload, *cursor));
}